

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

void __thiscall E64::settings_t::update_current_path_from_settings(settings_t *this)

{
  FILE *__stream;
  size_t sVar1;
  long in_RDI;
  size_t ln;
  FILE *temp_file;
  
  __stream = fopen("PATH","r");
  if (__stream == (FILE *)0x0) {
    printf("[Settings] current path not found in settings, defaulting to: %s\n",in_RDI + 0x308);
  }
  else {
    fgets((char *)(in_RDI + 0x308),0x100,__stream);
    sVar1 = strlen((char *)(in_RDI + 0x308));
    if ((*(char *)(in_RDI + 0x308) != '\0') && (*(char *)(in_RDI + 0x308 + (sVar1 - 1)) == '\n')) {
      *(undefined1 *)(in_RDI + 0x308 + (sVar1 - 1)) = 0;
    }
    printf("[Settings] current path is now: %s\n",in_RDI + 0x308);
    fclose(__stream);
    chdir((char *)(in_RDI + 0x308));
  }
  return;
}

Assistant:

void E64::settings_t::update_current_path_from_settings()
{
	FILE *temp_file = fopen("PATH", "r");
	if(temp_file) {
		fgets(current_path, 256, temp_file);
		size_t ln = strlen(current_path) - 1;
		if (*current_path && current_path[ln] == '\n')
			current_path[ln] = '\0';
		printf("[Settings] current path is now: %s\n", current_path);
		fclose(temp_file);
		chdir(current_path);
	} else {
		printf("[Settings] current path not found in settings, defaulting to: %s\n",
		       current_path);
	}
}